

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::GELU_x86_avx512::forward_inplace(GELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  undefined1 auVar31 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 (*pauVar27) [64];
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar32 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  float fVar41;
  float fVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar45;
  undefined1 in_ZMM1 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 extraout_var [60];
  undefined1 auVar49 [64];
  
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_GELU_x86_avx512[-3]) == 0) {
    iVar26 = GELU::forward_inplace
                       ((GELU *)((long)&this->_vptr_GELU_x86_avx512 +
                                (long)this->_vptr_GELU_x86_avx512[-3]),bottom_top_blob,opt);
    return iVar26;
  }
  iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
  uVar30 = 0;
  uVar29 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar29 = uVar30;
  }
  for (; uVar30 != uVar29; uVar30 = uVar30 + 1) {
    pauVar27 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar30 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    for (iVar28 = 0; iVar28 + 0xf < iVar26; iVar28 = iVar28 + 0x10) {
      auVar39 = *pauVar27;
      auVar36 = vmulps_avx512f(auVar39,auVar39);
      auVar37._8_4_ = 0x3d372713;
      auVar37._0_8_ = 0x3d3727133d372713;
      auVar37._12_4_ = 0x3d372713;
      auVar37._16_4_ = 0x3d372713;
      auVar37._20_4_ = 0x3d372713;
      auVar37._24_4_ = 0x3d372713;
      auVar37._28_4_ = 0x3d372713;
      auVar37._32_4_ = 0x3d372713;
      auVar37._36_4_ = 0x3d372713;
      auVar37._40_4_ = 0x3d372713;
      auVar37._44_4_ = 0x3d372713;
      auVar37._48_4_ = 0x3d372713;
      auVar37._52_4_ = 0x3d372713;
      auVar37._56_4_ = 0x3d372713;
      auVar37._60_4_ = 0x3d372713;
      auVar37 = vmulps_avx512f(auVar36,auVar37);
      auVar37 = vfmadd213ps_avx512f(auVar37,auVar39,auVar39);
      auVar36._8_4_ = 0x3f4c4229;
      auVar36._0_8_ = 0x3f4c42293f4c4229;
      auVar36._12_4_ = 0x3f4c4229;
      auVar36._16_4_ = 0x3f4c4229;
      auVar36._20_4_ = 0x3f4c4229;
      auVar36._24_4_ = 0x3f4c4229;
      auVar36._28_4_ = 0x3f4c4229;
      auVar36._32_4_ = 0x3f4c4229;
      auVar36._36_4_ = 0x3f4c4229;
      auVar36._40_4_ = 0x3f4c4229;
      auVar36._44_4_ = 0x3f4c4229;
      auVar36._48_4_ = 0x3f4c4229;
      auVar36._52_4_ = 0x3f4c4229;
      auVar36._56_4_ = 0x3f4c4229;
      auVar36._60_4_ = 0x3f4c4229;
      auVar37 = vmulps_avx512f(auVar37,auVar36);
      auVar37 = vmaxps_avx512f(auVar37,(undefined1  [64])_ps512_tanh_lo);
      auVar37 = vminps_avx512f(auVar37,(undefined1  [64])_ps512_tanh_hi);
      auVar36 = vmulps_avx512f(auVar37,auVar37);
      auVar38 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_tanh_p0,auVar36,
                                    (undefined1  [64])_ps512_cephes_tanh_p1);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])_ps512_cephes_tanh_p2);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])_ps512_cephes_tanh_p3);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])_ps512_cephes_tanh_p4);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])_ps512_cephes_tanh_p5);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])_ps512_cephes_tanh_p6);
      in_ZMM1 = vmulps_avx512f(auVar38,auVar37);
      auVar37 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_tanh_p7,auVar36,
                                    (undefined1  [64])_ps512_cephes_tanh_p8);
      auVar37 = vfmadd213ps_avx512f(auVar37,auVar36,(undefined1  [64])_ps512_cephes_tanh_p9);
      auVar37 = vfmadd213ps_avx512f(auVar37,auVar36,(undefined1  [64])_ps512_cephes_tanh_p6);
      in_ZMM2 = vrcp14ps_avx512f(auVar37);
      auVar36 = vmulps_avx512f(in_ZMM1,in_ZMM2);
      auVar37 = vfmsub213ps_avx512f(auVar37,auVar36,in_ZMM1);
      auVar37 = vfnmadd213ps_avx512f(auVar37,in_ZMM2,auVar36);
      auVar38._8_4_ = 0x3f000000;
      auVar38._0_8_ = 0x3f0000003f000000;
      auVar38._12_4_ = 0x3f000000;
      auVar38._16_4_ = 0x3f000000;
      auVar38._20_4_ = 0x3f000000;
      auVar38._24_4_ = 0x3f000000;
      auVar38._28_4_ = 0x3f000000;
      auVar38._32_4_ = 0x3f000000;
      auVar38._36_4_ = 0x3f000000;
      auVar38._40_4_ = 0x3f000000;
      auVar38._44_4_ = 0x3f000000;
      auVar38._48_4_ = 0x3f000000;
      auVar38._52_4_ = 0x3f000000;
      auVar38._56_4_ = 0x3f000000;
      auVar38._60_4_ = 0x3f000000;
      auVar39 = vmulps_avx512f(auVar39,auVar38);
      auVar39 = vfmadd213ps_avx512f(auVar39,auVar37,auVar39);
      *pauVar27 = auVar39;
      pauVar27 = pauVar27 + 1;
    }
    for (; iVar28 + 7 < iVar26; iVar28 = iVar28 + 8) {
      auVar35 = *(undefined1 (*) [32])*pauVar27;
      auVar39._0_4_ = auVar35._0_4_ * auVar35._0_4_;
      auVar39._4_4_ = auVar35._4_4_ * auVar35._4_4_;
      auVar39._8_4_ = auVar35._8_4_ * auVar35._8_4_;
      auVar39._12_4_ = auVar35._12_4_ * auVar35._12_4_;
      auVar39._16_4_ = auVar35._16_4_ * auVar35._16_4_;
      auVar39._20_4_ = auVar35._20_4_ * auVar35._20_4_;
      auVar39._28_36_ = in_ZMM1._28_36_;
      auVar39._24_4_ = auVar35._24_4_ * auVar35._24_4_;
      auVar33._8_4_ = 0x3d372713;
      auVar33._0_8_ = 0x3d3727133d372713;
      auVar33._12_4_ = 0x3d372713;
      auVar33._16_4_ = 0x3d372713;
      auVar33._20_4_ = 0x3d372713;
      auVar33._24_4_ = 0x3d372713;
      auVar33._28_4_ = 0x3d372713;
      auVar33 = vmulps_avx512vl(auVar39._0_32_,auVar33);
      auVar32 = vfmadd213ps_fma(auVar33,auVar35,auVar35);
      auVar34._8_4_ = 0x3f4c4229;
      auVar34._0_8_ = 0x3f4c42293f4c4229;
      auVar34._12_4_ = 0x3f4c4229;
      auVar34._16_4_ = 0x3f4c4229;
      auVar34._20_4_ = 0x3f4c4229;
      auVar34._24_4_ = 0x3f4c4229;
      auVar34._28_4_ = 0x3f4c4229;
      auVar33 = vmulps_avx512vl(ZEXT1632(auVar32),auVar34);
      auVar48._8_4_ = 0xc1100000;
      auVar48._0_8_ = 0xc1100000c1100000;
      auVar48._12_4_ = 0xc1100000;
      auVar48._16_4_ = 0xc1100000;
      auVar48._20_4_ = 0xc1100000;
      auVar48._24_4_ = 0xc1100000;
      auVar48._28_4_ = 0xc1100000;
      auVar33 = vmaxps_avx512vl(auVar33,auVar48);
      auVar15._8_4_ = 0x41100000;
      auVar15._0_8_ = 0x4110000041100000;
      auVar15._12_4_ = 0x41100000;
      auVar15._16_4_ = 0x41100000;
      auVar15._20_4_ = 0x41100000;
      auVar15._24_4_ = 0x41100000;
      auVar15._28_4_ = 0x41100000;
      auVar33 = vminps_avx512vl(auVar33,auVar15);
      fVar41 = auVar33._0_4_;
      auVar49._0_4_ = fVar41 * fVar41;
      fVar44 = auVar33._4_4_;
      auVar49._4_4_ = fVar44 * fVar44;
      fVar45 = auVar33._8_4_;
      auVar49._8_4_ = fVar45 * fVar45;
      fVar46 = auVar33._12_4_;
      auVar49._12_4_ = fVar46 * fVar46;
      fVar1 = auVar33._16_4_;
      auVar49._16_4_ = fVar1 * fVar1;
      fVar2 = auVar33._20_4_;
      auVar49._20_4_ = fVar2 * fVar2;
      fVar3 = auVar33._24_4_;
      auVar49._28_36_ = in_ZMM2._28_36_;
      auVar49._24_4_ = fVar3 * fVar3;
      auVar48 = auVar49._0_32_;
      auVar52._8_4_ = 0xa59f25c0;
      auVar52._0_8_ = 0xa59f25c0a59f25c0;
      auVar52._12_4_ = 0xa59f25c0;
      auVar52._16_4_ = 0xa59f25c0;
      auVar52._20_4_ = 0xa59f25c0;
      auVar52._24_4_ = 0xa59f25c0;
      auVar52._28_4_ = 0xa59f25c0;
      auVar16._8_4_ = 0x2a61337e;
      auVar16._0_8_ = 0x2a61337e2a61337e;
      auVar16._12_4_ = 0x2a61337e;
      auVar16._16_4_ = 0x2a61337e;
      auVar16._20_4_ = 0x2a61337e;
      auVar16._24_4_ = 0x2a61337e;
      auVar16._28_4_ = 0x2a61337e;
      auVar34 = vfmadd213ps_avx512vl(auVar52,auVar48,auVar16);
      auVar17._8_4_ = 0xaebd37ff;
      auVar17._0_8_ = 0xaebd37ffaebd37ff;
      auVar17._12_4_ = 0xaebd37ff;
      auVar17._16_4_ = 0xaebd37ff;
      auVar17._20_4_ = 0xaebd37ff;
      auVar17._24_4_ = 0xaebd37ff;
      auVar17._28_4_ = 0xaebd37ff;
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar48,auVar17);
      auVar18._8_4_ = 0x335c0041;
      auVar18._0_8_ = 0x335c0041335c0041;
      auVar18._12_4_ = 0x335c0041;
      auVar18._16_4_ = 0x335c0041;
      auVar18._20_4_ = 0x335c0041;
      auVar18._24_4_ = 0x335c0041;
      auVar18._28_4_ = 0x335c0041;
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar48,auVar18);
      auVar19._8_4_ = 0x3779434a;
      auVar19._0_8_ = 0x3779434a3779434a;
      auVar19._12_4_ = 0x3779434a;
      auVar19._16_4_ = 0x3779434a;
      auVar19._20_4_ = 0x3779434a;
      auVar19._24_4_ = 0x3779434a;
      auVar19._28_4_ = 0x3779434a;
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar48,auVar19);
      auVar20._8_4_ = 0x3a270ded;
      auVar20._0_8_ = 0x3a270ded3a270ded;
      auVar20._12_4_ = 0x3a270ded;
      auVar20._16_4_ = 0x3a270ded;
      auVar20._20_4_ = 0x3a270ded;
      auVar20._24_4_ = 0x3a270ded;
      auVar20._28_4_ = 0x3a270ded;
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar48,auVar20);
      auVar56._8_4_ = 0x3ba059dc;
      auVar56._0_8_ = 0x3ba059dc3ba059dc;
      auVar56._12_4_ = 0x3ba059dc;
      auVar56._16_4_ = 0x3ba059dc;
      auVar56._20_4_ = 0x3ba059dc;
      auVar56._24_4_ = 0x3ba059dc;
      auVar56._28_4_ = 0x3ba059dc;
      auVar32 = vfmadd213ps_fma(auVar34,auVar48,auVar56);
      fVar41 = auVar32._0_4_ * fVar41;
      fVar44 = auVar32._4_4_ * fVar44;
      auVar24._4_4_ = fVar44;
      auVar24._0_4_ = fVar41;
      fVar45 = auVar32._8_4_ * fVar45;
      auVar24._8_4_ = fVar45;
      fVar46 = auVar32._12_4_ * fVar46;
      auVar24._12_4_ = fVar46;
      auVar24._16_4_ = fVar1 * 0.0;
      auVar24._20_4_ = fVar2 * 0.0;
      auVar24._24_4_ = fVar3 * 0.0;
      auVar24._28_4_ = auVar33._28_4_;
      in_ZMM1 = ZEXT3264(auVar24);
      auVar53._8_4_ = 0x35a0d3d8;
      auVar53._0_8_ = 0x35a0d3d835a0d3d8;
      auVar53._12_4_ = 0x35a0d3d8;
      auVar53._16_4_ = 0x35a0d3d8;
      auVar53._20_4_ = 0x35a0d3d8;
      auVar53._24_4_ = 0x35a0d3d8;
      auVar53._28_4_ = 0x35a0d3d8;
      auVar21._8_4_ = 0x38f895d6;
      auVar21._0_8_ = 0x38f895d638f895d6;
      auVar21._12_4_ = 0x38f895d6;
      auVar21._16_4_ = 0x38f895d6;
      auVar21._20_4_ = 0x38f895d6;
      auVar21._24_4_ = 0x38f895d6;
      auVar21._28_4_ = 0x38f895d6;
      auVar33 = vfmadd213ps_avx512vl(auVar53,auVar48,auVar21);
      auVar22._8_4_ = 0x3b14aa05;
      auVar22._0_8_ = 0x3b14aa053b14aa05;
      auVar22._12_4_ = 0x3b14aa05;
      auVar22._16_4_ = 0x3b14aa05;
      auVar22._20_4_ = 0x3b14aa05;
      auVar22._24_4_ = 0x3b14aa05;
      auVar22._28_4_ = 0x3b14aa05;
      auVar33 = vfmadd213ps_avx512vl(auVar33,auVar48,auVar22);
      auVar32 = vfmadd213ps_fma(auVar33,auVar48,auVar56);
      auVar33 = vrcpps_avx(ZEXT1632(auVar32));
      in_ZMM2 = ZEXT3264(auVar33);
      auVar25._4_4_ = fVar44 * auVar33._4_4_;
      auVar25._0_4_ = fVar41 * auVar33._0_4_;
      auVar25._8_4_ = fVar45 * auVar33._8_4_;
      auVar25._12_4_ = fVar46 * auVar33._12_4_;
      auVar25._16_4_ = fVar1 * 0.0 * auVar33._16_4_;
      auVar25._20_4_ = fVar2 * 0.0 * auVar33._20_4_;
      auVar25._24_4_ = fVar3 * 0.0 * auVar33._24_4_;
      auVar25._28_4_ = 0x3ba059dc;
      auVar32 = vfmsub213ps_fma(ZEXT1632(auVar32),auVar25,auVar24);
      auVar32 = vfnmadd213ps_fma(ZEXT1632(auVar32),auVar33,auVar25);
      auVar23._8_4_ = 0x3f000000;
      auVar23._0_8_ = 0x3f0000003f000000;
      auVar23._12_4_ = 0x3f000000;
      auVar23._16_4_ = 0x3f000000;
      auVar23._20_4_ = 0x3f000000;
      auVar23._24_4_ = 0x3f000000;
      auVar23._28_4_ = 0x3f000000;
      auVar35 = vmulps_avx512vl(auVar35,auVar23);
      auVar32 = vfmadd213ps_fma(auVar35,ZEXT1632(auVar32),auVar35);
      *(undefined1 (*) [32])*pauVar27 = ZEXT1632(auVar32);
      pauVar27 = (undefined1 (*) [64])(*pauVar27 + 0x20);
    }
    for (; iVar28 + 3 < iVar26; iVar28 = iVar28 + 4) {
      auVar32 = *(undefined1 (*) [16])*pauVar27;
      auVar42._0_4_ = auVar32._0_4_ * auVar32._0_4_;
      auVar42._4_4_ = auVar32._4_4_ * auVar32._4_4_;
      auVar42._8_4_ = auVar32._8_4_ * auVar32._8_4_;
      auVar42._12_4_ = auVar32._12_4_ * auVar32._12_4_;
      auVar31._8_4_ = 0x3d372713;
      auVar31._0_8_ = 0x3d3727133d372713;
      auVar31._12_4_ = 0x3d372713;
      auVar31 = vmulps_avx512vl(auVar42,auVar31);
      auVar31 = vfmadd213ps_fma(auVar31,auVar32,auVar32);
      auVar4._8_4_ = 0x3f4c4229;
      auVar4._0_8_ = 0x3f4c42293f4c4229;
      auVar4._12_4_ = 0x3f4c4229;
      auVar31 = vmulps_avx512vl(auVar31,auVar4);
      auVar5._8_4_ = 0xc1100000;
      auVar5._0_8_ = 0xc1100000c1100000;
      auVar5._12_4_ = 0xc1100000;
      auVar31 = vmaxps_avx512vl(auVar31,auVar5);
      auVar6._8_4_ = 0x41100000;
      auVar6._0_8_ = 0x4110000041100000;
      auVar6._12_4_ = 0x41100000;
      auVar31 = vminps_avx512vl(auVar31,auVar6);
      fVar41 = auVar31._0_4_;
      auVar47._0_4_ = fVar41 * fVar41;
      fVar44 = auVar31._4_4_;
      auVar47._4_4_ = fVar44 * fVar44;
      fVar45 = auVar31._8_4_;
      auVar47._8_4_ = fVar45 * fVar45;
      fVar46 = auVar31._12_4_;
      auVar47._12_4_ = fVar46 * fVar46;
      auVar50._8_4_ = 0xa59f25c0;
      auVar50._0_8_ = 0xa59f25c0a59f25c0;
      auVar50._12_4_ = 0xa59f25c0;
      auVar7._8_4_ = 0x2a61337e;
      auVar7._0_8_ = 0x2a61337e2a61337e;
      auVar7._12_4_ = 0x2a61337e;
      auVar31 = vfmadd213ps_avx512vl(auVar50,auVar47,auVar7);
      auVar8._8_4_ = 0xaebd37ff;
      auVar8._0_8_ = 0xaebd37ffaebd37ff;
      auVar8._12_4_ = 0xaebd37ff;
      auVar31 = vfmadd213ps_avx512vl(auVar31,auVar47,auVar8);
      auVar9._8_4_ = 0x335c0041;
      auVar9._0_8_ = 0x335c0041335c0041;
      auVar9._12_4_ = 0x335c0041;
      auVar31 = vfmadd213ps_avx512vl(auVar31,auVar47,auVar9);
      auVar10._8_4_ = 0x3779434a;
      auVar10._0_8_ = 0x3779434a3779434a;
      auVar10._12_4_ = 0x3779434a;
      auVar31 = vfmadd213ps_avx512vl(auVar31,auVar47,auVar10);
      auVar11._8_4_ = 0x3a270ded;
      auVar11._0_8_ = 0x3a270ded3a270ded;
      auVar11._12_4_ = 0x3a270ded;
      auVar31 = vfmadd213ps_avx512vl(auVar31,auVar47,auVar11);
      auVar54._8_4_ = 0x3ba059dc;
      auVar54._0_8_ = 0x3ba059dc3ba059dc;
      auVar54._12_4_ = 0x3ba059dc;
      auVar31 = vfmadd213ps_fma(auVar31,auVar47,auVar54);
      auVar43._0_4_ = auVar31._0_4_ * fVar41;
      auVar43._4_4_ = auVar31._4_4_ * fVar44;
      auVar43._8_4_ = auVar31._8_4_ * fVar45;
      auVar43._12_4_ = auVar31._12_4_ * fVar46;
      in_ZMM1 = ZEXT1664(auVar43);
      auVar51._8_4_ = 0x35a0d3d8;
      auVar51._0_8_ = 0x35a0d3d835a0d3d8;
      auVar51._12_4_ = 0x35a0d3d8;
      auVar12._8_4_ = 0x38f895d6;
      auVar12._0_8_ = 0x38f895d638f895d6;
      auVar12._12_4_ = 0x38f895d6;
      auVar31 = vfmadd213ps_avx512vl(auVar51,auVar47,auVar12);
      auVar13._8_4_ = 0x3b14aa05;
      auVar13._0_8_ = 0x3b14aa053b14aa05;
      auVar13._12_4_ = 0x3b14aa05;
      auVar31 = vfmadd213ps_avx512vl(auVar31,auVar47,auVar13);
      auVar4 = vfmadd213ps_fma(auVar31,auVar47,auVar54);
      auVar31 = vrcpps_avx(auVar4);
      in_ZMM2 = ZEXT1664(auVar31);
      auVar55._0_4_ = auVar43._0_4_ * auVar31._0_4_;
      auVar55._4_4_ = auVar43._4_4_ * auVar31._4_4_;
      auVar55._8_4_ = auVar43._8_4_ * auVar31._8_4_;
      auVar55._12_4_ = auVar43._12_4_ * auVar31._12_4_;
      auVar4 = vfmsub213ps_fma(auVar4,auVar55,auVar43);
      auVar31 = vfnmadd213ps_fma(auVar4,auVar31,auVar55);
      auVar14._8_4_ = 0x3f000000;
      auVar14._0_8_ = 0x3f0000003f000000;
      auVar14._12_4_ = 0x3f000000;
      auVar32 = vmulps_avx512vl(auVar32,auVar14);
      auVar32 = vfmadd213ps_fma(auVar32,auVar31,auVar32);
      *(undefined1 (*) [16])*pauVar27 = auVar32;
      pauVar27 = (undefined1 (*) [64])(*pauVar27 + 0x10);
    }
    for (; iVar28 < iVar26; iVar28 = iVar28 + 1) {
      fVar41 = *(float *)*pauVar27;
      fVar44 = fVar41 * 0.5;
      auVar32 = vfmadd213ss_fma(ZEXT416((uint)(fVar41 * fVar41 * 0.044715)),ZEXT416((uint)fVar41),
                                ZEXT416((uint)fVar41));
      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
      auVar40._0_4_ = tanhf(auVar32._0_4_ * 0.7978845);
      auVar40._4_60_ = extraout_var;
      in_ZMM1 = ZEXT464((uint)fVar44);
      auVar32 = vfmadd213ss_fma(auVar40._0_16_,ZEXT416((uint)fVar44),ZEXT416((uint)fVar44));
      *(int *)*pauVar27 = auVar32._0_4_;
      pauVar27 = (undefined1 (*) [64])(*pauVar27 + 4);
    }
  }
  return 0;
}

Assistant:

int GELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}